

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_conn_cf_cntrl(Curl_cfilter *cf,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                           void *arg2)

{
  CURLcode local_34;
  CURLcode result;
  void *arg2_local;
  int arg1_local;
  int event_local;
  _Bool ignore_result_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_34 = CURLE_OK;
  data_local = (Curl_easy *)cf;
  while ((data_local != (Curl_easy *)0x0 &&
         (((*(code **)(*(long *)data_local + 0x58) == Curl_cf_def_cntrl ||
           (local_34 = (**(code **)(*(long *)data_local + 0x58))(data_local,data,event,arg1,arg2),
           ignore_result)) || (local_34 == CURLE_OK))))) {
    data_local = (Curl_easy *)data_local->id;
  }
  return local_34;
}

Assistant:

CURLcode Curl_conn_cf_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            bool ignore_result,
                            int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;

  for(; cf; cf = cf->next) {
    if(Curl_cf_def_cntrl == cf->cft->cntrl)
      continue;
    result = cf->cft->cntrl(cf, data, event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}